

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void init_array_internal(double *a,int ndim,int *dims)

{
  double val;
  double field;
  int Index;
  int elems;
  int dim;
  int i;
  int idx [7];
  int *dims_local;
  int ndim_local;
  double *a_local;
  
  elems = 1;
  for (i = 0; i < ndim; i = i + 1) {
    elems = dims[i] * elems;
  }
  for (i = 0; i < elems; i = i + 1) {
    Index = i;
    for (dim = 0; dim < ndim; dim = dim + 1) {
      idx[dim] = Index % dims[dim];
      Index = Index / dims[dim];
    }
    field = 1.0;
    val = 0.0;
    for (dim = 0; dim < ndim; dim = dim + 1) {
      val = field * (double)idx[dim] + val;
      field = field * 100.0;
    }
    a[i] = val;
  }
  return;
}

Assistant:

void init_array_internal(double *a, int ndim, int dims[])
{
    int idx[GA_MAX_DIM];
    int i,dim, elems;

        elems = 1;
        for(i=0;i<ndim;i++)elems *= dims[i];

     for(i=0; i<elems; i++){
        int Index = i;
        double field, val;
        
        for(dim = 0; dim < ndim; dim++){
            idx[dim] = Index%dims[dim];
            Index /= dims[dim];
        }
        
                field=1.; val=0.;
        for(dim=0; dim< ndim;dim++){
            val += field*idx[dim];
            field *= BASE;
        }
        a[i] = val;
        /* printf("(%d,%d,%d)=%6.0f",idx[0],idx[1],idx[2],val); */
    }
}